

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Bundle::AddPDU(Bundle *this,KDataStream *K)

{
  KUINT16 KVar1;
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *K_local;
  Bundle *this_local;
  
  local_18 = K;
  K_local = (KDataStream *)this;
  std::vector<KDIS::KDataStream,_std::allocator<KDIS::KDataStream>_>::push_back(&this->m_vStreams,K)
  ;
  KVar1 = KDataStream::GetBufferSize(local_18);
  this->m_ui16Length = this->m_ui16Length + KVar1;
  if (0x2000 < this->m_ui16Length) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"AddPDU",&local_39);
    KException::KException(this_00,&local_38,0xb);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  return;
}

Assistant:

void Bundle::AddPDU(const KDataStream &K) noexcept(false)
{
    m_vStreams.push_back( K );
    m_ui16Length += K.GetBufferSize();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}